

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

void __thiscall libcellml::Component::removeAllResets(Component *this)

{
  undefined8 *puVar1;
  ResetImpl *this_00;
  EntityImpl *pEVar2;
  shared_ptr<libcellml::Reset> *reset;
  undefined8 *puVar3;
  
  pEVar2 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  puVar3 = (undefined8 *)pEVar2[5].mId.field_2._M_allocated_capacity;
  puVar1 = *(undefined8 **)((long)&pEVar2[5].mId.field_2 + 8);
  if (puVar3 != puVar1) {
    do {
      this_00 = Reset::pFunc((Reset *)*puVar3);
      ParentedEntity::ParentedEntityImpl::removeParent(&this_00->super_ParentedEntityImpl);
      puVar3 = puVar3 + 2;
    } while (puVar3 != puVar1);
    pEVar2 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
  }
  std::
  vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
  clear((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
         *)&pEVar2[5].mId.field_2);
  return;
}

Assistant:

void Component::removeAllResets()
{
    for (const auto &reset : pFunc()->mResets) {
        reset->pFunc()->removeParent();
    }
    pFunc()->mResets.clear();
}